

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> * __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  int iVar1;
  long lVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar ***pppuVar5;
  
  iVar1 = this->depth;
  this->depth = a->depth;
  a->depth = iVar1;
  lVar2 = this->width;
  this->width = a->width;
  a->width = lVar2;
  lVar2 = this->height;
  this->height = a->height;
  a->height = lVar2;
  lVar2 = this->n;
  this->n = a->n;
  a->n = lVar2;
  puVar3 = this->pixel;
  this->pixel = a->pixel;
  a->pixel = puVar3;
  ppuVar4 = this->row;
  this->row = a->row;
  a->row = ppuVar4;
  pppuVar5 = this->img;
  this->img = a->img;
  a->img = pppuVar5;
  return this;
}

Assistant:

Image<T> &operator=(Image<T> &&a) noexcept
    {
      std::swap(depth, a.depth);
      std::swap(width, a.width);
      std::swap(height, a.height);
      std::swap(n, a.n);
      std::swap(pixel, a.pixel);
      std::swap(row, a.row);
      std::swap(img, a.img);

      return *this;
    }